

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

void __thiscall spvtools::opt::InlinePass::InlinePass(InlinePass *this)

{
  _Rb_tree_header *p_Var1;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__InlinePass_008afa88;
  (this->id2function_)._M_h._M_buckets = &(this->id2function_)._M_h._M_single_bucket;
  (this->id2function_)._M_h._M_bucket_count = 1;
  (this->id2function_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id2function_)._M_h._M_element_count = 0;
  (this->id2function_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id2function_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id2function_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->id2block_)._M_h._M_buckets = &(this->id2block_)._M_h._M_single_bucket;
  (this->id2block_)._M_h._M_bucket_count = 1;
  (this->id2block_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id2block_)._M_h._M_element_count = 0;
  (this->id2block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id2block_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id2block_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header;
  (this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->no_return_in_loop_)._M_t._M_impl.super__Rb_tree_header;
  (this->no_return_in_loop_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->no_return_in_loop_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->no_return_in_loop_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->no_return_in_loop_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->no_return_in_loop_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->inlinable_)._M_t._M_impl.super__Rb_tree_header;
  (this->inlinable_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inlinable_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inlinable_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->inlinable_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->inlinable_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->funcs_called_from_continue_)._M_h._M_buckets =
       &(this->funcs_called_from_continue_)._M_h._M_single_bucket;
  (this->funcs_called_from_continue_)._M_h._M_bucket_count = 1;
  (this->funcs_called_from_continue_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcs_called_from_continue_)._M_h._M_element_count = 0;
  (this->funcs_called_from_continue_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcs_called_from_continue_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcs_called_from_continue_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

InlinePass::InlinePass() {}